

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_close_notify(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  
  iVar3 = -0x7100;
  if ((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) {
    if (ssl->out_left != 0) {
      if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
        return -0x7100;
      }
      sVar6 = ssl->out_left;
      if (sVar6 == 0) {
        iVar3 = 0;
      }
      else {
        while (sVar6 != 0) {
          uVar2 = (*ssl->f_send)(ssl->p_bio,
                                 ssl->out_hdr +
                                 ((ssl->out_msglen +
                                  (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4) - sVar6) + 5,
                                 sVar6);
          if ((int)uVar2 < 1) {
            return uVar2;
          }
          sVar6 = ssl->out_left - (ulong)uVar2;
          if (ssl->out_left < (ulong)uVar2) {
            return -0x6c00;
          }
          ssl->out_left = sVar6;
        }
        uVar7 = 8;
        do {
          uVar5 = *(uint *)&ssl->conf->field_0x174 & 2;
          uVar4 = uVar7 & 0xff;
          uVar2 = (uint)uVar4;
          if (uVar2 <= uVar5) goto LAB_00112088;
          uVar7 = (ulong)(uVar2 - 1);
          puVar1 = ssl->out_ctr + (uVar4 - 1);
          *puVar1 = *puVar1 + '\x01';
        } while (*puVar1 == '\0');
        uVar5 = *(uint *)&ssl->conf->field_0x174 & 2;
LAB_00112088:
        iVar3 = -0x6b80;
        if (uVar5 != uVar2) {
          iVar3 = 0;
        }
      }
      return iVar3;
    }
    if ((ssl->state != 0x10) ||
       (iVar3 = mbedtls_ssl_send_alert_message(ssl,'\x01','\0'), iVar3 == 0)) {
      return 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_close_notify( mbedtls_ssl_context *ssl )
{
    int ret;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write close notify" ) );

    if( ssl->out_left != 0 )
        return( mbedtls_ssl_flush_output( ssl ) );

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_WARNING,
                        MBEDTLS_SSL_ALERT_MSG_CLOSE_NOTIFY ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_send_alert_message", ret );
            return( ret );
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write close notify" ) );

    return( 0 );
}